

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-util.c
# Opt level: O0

uint ext_u16n(uint16_t *a,size_t n)

{
  byte bVar1;
  size_t shift;
  size_t rb;
  size_t i;
  uint result;
  size_t n_local;
  uint16_t *a_local;
  
  i._4_4_ = 0;
  shift = 0x20;
  bVar1 = 0;
  rb = n;
  while( true ) {
    if (rb == 0) {
      return i._4_4_;
    }
    if (shift == 0) break;
    rb = rb - 1;
    if (shift < 0x10) {
      return (((uint)a[rb] & (1 << ((byte)shift & 0x1f)) - 1U) << (bVar1 & 0x1f)) + i._4_4_;
    }
    i._4_4_ = ((uint)a[rb] << (bVar1 & 0x1f)) + i._4_4_;
    shift = shift - 0x10;
    bVar1 = bVar1 + 0x10;
  }
  return i._4_4_;
}

Assistant:

static unsigned int ext_u16n(const uint16_t *a, size_t n)
{
	unsigned int result = 0;
	size_t i = n;
	size_t rb = sizeof(unsigned int) * CHAR_BIT;
	size_t shift = 0;

	while (1) {
		if (i == 0 || rb == 0) {
			break;
		}
		--i;
		if (rb < 16) {
			result += (a[i] & ((1U << rb) - 1)) << shift;
			break;
		}
		result += (unsigned int)a[i] << shift;
		rb -= 16;
		shift += 16;
	}
	return result;
}